

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O3

int __thiscall ON_PolyCurve::CloseGaps(ON_PolyCurve *this)

{
  int iVar1;
  uint segment_index;
  bool bVar2;
  int ends_to_modify;
  int iVar3;
  uint uVar4;
  uint gap_index;
  
  iVar3 = 0;
  uVar4 = 0;
  while( true ) {
    iVar1 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
    gap_index = uVar4;
    do {
      segment_index = gap_index;
      gap_index = segment_index + 1;
      if (iVar1 <= (int)gap_index) {
        return iVar3;
      }
      bVar2 = HasGapAt(this,segment_index);
    } while (!bVar2);
    if ((segment_index < uVar4) ||
       ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count <= (int)gap_index)) break;
    bVar2 = CloseGap(this,gap_index,ends_to_modify);
    iVar3 = iVar3 + (uint)bVar2;
    uVar4 = gap_index;
  }
  return iVar3;
}

Assistant:

int ON_PolyCurve::CloseGaps()
{
  int rc = 0;
  int segment_index0 = 0;
  int gap_index = 0;
  
  for(;;)
  {
    gap_index = FindNextGap(segment_index0);
    if ( gap_index <= segment_index0 || gap_index >= m_segment.Count() )
      break;
    if ( CloseGap(gap_index,0) )
      rc++;
    segment_index0 = gap_index;
  }

  return rc;
}